

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NPA.cpp
# Opt level: O0

RealType __thiscall OpenMD::NPA::calcConservedQuantity(NPA *this)

{
  int iVar1;
  long *in_RDI;
  RealType RVar2;
  double dVar3;
  SquareMatrix<double,_3> tmp;
  RealType trEta;
  RealType barostat_potential;
  RealType barostat_kinetic;
  RealType totalEnergy;
  RealType conservedQuantity;
  SquareMatrix<double,_3> *in_stack_fffffffffffffea8;
  SquareMatrix<double,_3> *in_stack_fffffffffffffeb0;
  Thermo *in_stack_fffffffffffffec0;
  SquareMatrix3<double> *m2;
  SquareMatrix3<double> *in_stack_fffffffffffffee8;
  SquareMatrix3<double> local_108 [2];
  SquareMatrix<double,_3> local_78;
  double local_30;
  double local_28;
  double local_20;
  RealType local_18;
  double local_10;
  
  (**(code **)(*in_RDI + 0xc0))();
  iVar1 = SimInfo::getNGlobalIntegrableObjects((SimInfo *)in_RDI[0xe]);
  in_RDI[0x1f] = (long)((double)iVar1 * 8.31451e-07 * (double)in_RDI[0x26]);
  local_18 = Thermo::getTotalEnergy(in_stack_fffffffffffffec0);
  m2 = (SquareMatrix3<double> *)(in_RDI + 0x41);
  SquareMatrix3<double>::transpose(local_108);
  OpenMD::operator*(in_stack_fffffffffffffee8,m2);
  SquareMatrix<double,_3>::SquareMatrix(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2913d1);
  SquareMatrix3<double>::~SquareMatrix3((SquareMatrix3<double> *)0x2913db);
  local_30 = SquareMatrix<double,_3>::trace(&local_78);
  local_20 = ((double)in_RDI[0x1f] * (double)in_RDI[0x22] * local_30) / 0.0008368;
  dVar3 = (double)in_RDI[0x27];
  RVar2 = Thermo::getVolume((Thermo *)in_stack_fffffffffffffeb0);
  local_28 = ((dVar3 * RVar2) / 163882576.0) / 0.0004184;
  dVar3 = local_18 + local_20 + local_28;
  local_10 = dVar3;
  SquareMatrix<double,_3>::~SquareMatrix((SquareMatrix<double,_3> *)0x2914cd);
  return dVar3;
}

Assistant:

RealType NPA::calcConservedQuantity() {
    loadEta();

    // We need NkBT a lot, so just set it here: This is the RAW number
    // of integrableObjects, so no subtraction or addition of constraints or
    // orientational degrees of freedom:
    NkBT = info_->getNGlobalIntegrableObjects() * Constants::kB * targetTemp;

    RealType conservedQuantity;
    RealType totalEnergy;
    RealType barostat_kinetic;
    RealType barostat_potential;
    RealType trEta;

    totalEnergy = thermo.getTotalEnergy();

    SquareMatrix<RealType, 3> tmp = eta.transpose() * eta;
    trEta                         = tmp.trace();

    barostat_kinetic = NkBT * tb2 * trEta / (2.0 * Constants::energyConvert);

    barostat_potential =
        (targetPressure * thermo.getVolume() / Constants::pressureConvert) /
        Constants::energyConvert;

    conservedQuantity = totalEnergy + barostat_kinetic + barostat_potential;

    return conservedQuantity;
  }